

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree.hpp
# Opt level: O2

void __thiscall
pico_tree::
kd_tree<std::reference_wrapper<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>,pico_tree::metric_l2_squared,int>
::
kd_tree<pico_tree::max_leaf_size_t,pico_tree::bounds_from_space_t,pico_tree::sliding_midpoint_max_side_t>
          (kd_tree<std::reference_wrapper<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>,pico_tree::metric_l2_squared,int>
           *this,space_type space,
          splitter_stop_condition_t<pico_tree::max_leaf_size_t> *stop_condition,
          splitter_start_bounds_t<pico_tree::bounds_from_space_t> *start_bounds,
          splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *rule)

{
  undefined1 local_1;
  
  *(vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> **)this = space._M_data
  ;
  internal::
  build_kd_tree<pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,float>,3ul>,3ul>
  ::operator()((kd_tree_data_type *)(this + 0x10),&local_1,
               (space_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                )space._M_data,stop_condition,start_bounds,rule);
  return;
}

Assistant:

kd_tree(
      space_type space,
      splitter_stop_condition_t<Stop_> const& stop_condition,
      splitter_start_bounds_t<Bounds_> const& start_bounds = Bounds_{},
      splitter_rule_t<Rule_> const& rule = Rule_{})
      : space_(std::move(space)),
        metric_(),
        data_(
            internal::build_kd_tree<kd_tree_data_type, dim>()(
                space_wrapper_type(space_),
                stop_condition,
                start_bounds,
                rule)) {}